

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

btVector3 operator*(btVector3 *v,btScalar *s)

{
  float fVar1;
  btVector3 bVar2;
  
  fVar1 = *s;
  bVar2.m_floats[0] = fVar1 * (float)*(undefined8 *)v->m_floats;
  bVar2.m_floats[1] = fVar1 * (float)((ulong)*(undefined8 *)v->m_floats >> 0x20);
  bVar2.m_floats[2] = fVar1 * v->m_floats[2];
  bVar2.m_floats[3] = 0.0;
  return (btVector3)bVar2.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v, const btScalar& s)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	__m128	vs = _mm_load_ss(&s);	//	(S 0 0 0)
	vs = bt_pshufd_ps(vs, 0x80);	//	(S S S 0.0)
	return btVector3(_mm_mul_ps(v.mVec128, vs));
#elif defined(BT_USE_NEON)
	float32x4_t r = vmulq_n_f32(v.mVec128, s);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(v.m_floats[0] * s, v.m_floats[1] * s, v.m_floats[2] * s);
#endif
}